

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O3

Formula * Kernel::SubstHelper::
          applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                    (Formula *f,DerefApplicator *applicator,bool noSharing)

{
  Formula *pFVar1;
  void **head_1;
  void **head;
  
  pFVar1 = (Formula *)
           (*(code *)(&DAT_008d4ffc + *(int *)(&DAT_008d4ffc + (ulong)f->_connective * 4)))();
  return pFVar1;
}

Assistant:

Formula* SubstHelper::applyImpl(Formula* f, Applicator& applicator, bool noSharing)
{
  switch (f->connective()) {
  case LITERAL:
  {
    Literal* lit = static_cast<Literal*>(applyImpl<ProcessSpecVars>(f->literal(), applicator, noSharing));
    return lit == f->literal() ? f : new AtomicFormula(lit);
  }

  case AND:
  case OR:
  {
    FormulaList* newArgs = applyImpl<ProcessSpecVars>(f->args(), applicator, noSharing);
    if (newArgs == f->args()) {
      return f;
    }
    return new JunctionFormula(f->connective(), newArgs);
  }

  case IMP:
  case IFF:
  case XOR:
  {
    Formula* l = applyImpl<ProcessSpecVars>(f->left(), applicator, noSharing);
    Formula* r = applyImpl<ProcessSpecVars>(f->right(), applicator, noSharing);
    if (l == f->left() && r == f->right()) {
      return f;
    }
    return new BinaryFormula(f->connective(), l, r);
  }

  case NOT:
  {
    Formula* arg = applyImpl<ProcessSpecVars>(f->uarg(), applicator, noSharing);
    if (f->uarg() == arg) {
      return f;
    }
    return new NegatedFormula(arg);
  }

  case FORALL:
  case EXISTS:
  {
    bool varsModified = false;
    VList* newVars = VList::empty();
    VList::Iterator vit(f->vars());
    while(vit.hasNext()) {
      unsigned v = vit.next();
      TermList binding = applicator.apply(v);
      ASS(binding.isVar());
      unsigned newVar = binding.var();
      VList::push(newVar, newVars);
      if(newVar!=v) {
        varsModified = true;
      }
    }

    Formula* arg = applyImpl<ProcessSpecVars>(f->qarg(), applicator, noSharing);
    if (!varsModified && arg == f->qarg()) {
      VList::destroy(newVars);
      return f;
    }
    //TODO compute an updated sorts list
    return new QuantifiedFormula(f->connective(),newVars,0,arg);
  }

  case BOOL_TERM:
    return BoolTermFormula::create(applyImpl<ProcessSpecVars>(f->getBooleanTerm(), applicator, noSharing));

  case TRUE:
  case FALSE:
    return f;
  default:
    ASSERTION_VIOLATION;
  }
}